

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O0

void gz_compress(FILE *in,gzFile out)

{
  int iVar1;
  size_t sVar2;
  char *msg;
  undefined1 local_4020 [4];
  int local_401c;
  int err;
  int len;
  char buf [16384];
  gzFile out_local;
  FILE *in_local;
  
  buf._16376_8_ = out;
  while( true ) {
    sVar2 = fread(&err,1,0x4000,(FILE *)in);
    local_401c = (int)sVar2;
    iVar1 = ferror((FILE *)in);
    if (iVar1 != 0) {
      perror("fread");
      exit(1);
    }
    if (local_401c == 0) break;
    iVar1 = gzwrite(buf._16376_8_,&err,local_401c);
    if (iVar1 != local_401c) {
      msg = (char *)gzerror(buf._16376_8_,local_4020);
      error(msg);
    }
  }
  fclose((FILE *)in);
  iVar1 = gzclose(buf._16376_8_);
  if (iVar1 != 0) {
    error("failed gzclose");
  }
  return;
}

Assistant:

void gz_compress(in, out)
    FILE   *in;
    gzFile out;
{
    local char buf[BUFLEN];
    int len;
    int err;

#ifdef USE_MMAP
    /* Try first compressing with mmap. If mmap fails (minigzip used in a
     * pipe), use the normal fread loop.
     */
    if (gz_compress_mmap(in, out) == Z_OK) return;
#endif
    for (;;) {
        len = (int)fread(buf, 1, sizeof(buf), in);
        if (ferror(in)) {
            perror("fread");
            exit(1);
        }
        if (len == 0) break;

        if (gzwrite(out, buf, (unsigned)len) != len) error(gzerror(out, &err));
    }
    fclose(in);
    if (gzclose(out) != Z_OK) error("failed gzclose");
}